

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O2

_Bool borg_best_stuff(void)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  borg_shop *pbVar4;
  _Bool _Var5;
  uint16_t uVar6;
  uint8_t *best;
  uint8_t *test;
  borg_item_conflict *pbVar7;
  char *what;
  ulong uVar8;
  borg_item_conflict *pbVar9;
  int16_t *piVar10;
  int32_t value;
  
  if (shop_num == 7) {
    if (!borg.goal.do_best) {
      _Var5 = borg_one_step_wearing_best(0);
      return _Var5;
    }
    _Var5 = borg_home_full();
    if (((!_Var5) && (_Var5 = borg_inventory_full(), !_Var5)) && (borg.goal.do_best == true)) {
      best = (uint8_t *)mem_alloc((ulong)z_info->equip_slots_max);
      test = (uint8_t *)mem_alloc((ulong)z_info->equip_slots_max);
      for (uVar8 = 0; uVar8 < z_info->equip_slots_max; uVar8 = uVar8 + 1) {
        test[uVar8] = 0xff;
        best[uVar8] = 0xff;
      }
      value = borg.power;
      borg_best_stuff_aux(0,test,best,&value);
      borg_notice(true);
      borg.goal.best_item = (borg_best *)mem_zalloc((ulong)z_info->equip_slots_max * 6);
      pbVar4 = borg_shops;
      pbVar9 = borg_items;
      uVar2 = z_info->equip_slots_max;
      piVar10 = &(borg.goal.best_item)->pval;
      bVar3 = false;
      for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
        bVar1 = best[uVar8];
        uVar6 = borg_best_stuff_order((int)uVar8);
        if ((bVar1 != 0xff) && (uVar6 != bVar1)) {
          if (bVar1 < 100) {
            pbVar7 = pbVar9 + bVar1;
          }
          else {
            pbVar7 = pbVar4[7].ware + ((ulong)bVar1 - 100);
            ((borg_best *)(piVar10 + -2))->home = true;
          }
          *(uint8_t *)((long)piVar10 + -3) = pbVar7->tval;
          *piVar10 = pbVar7->pval;
          *(uint8_t *)(piVar10 + -1) = pbVar7->sval;
          bVar3 = true;
        }
        piVar10 = piVar10 + 3;
      }
      if (!bVar3) {
        borg_clear_best();
      }
      borg.goal.do_best = false;
      if (*borg_cfg != 0) {
        if (bVar3) {
          for (uVar8 = 0; uVar8 < z_info->equip_slots_max; uVar8 = uVar8 + 1) {
            bVar1 = best[uVar8];
            if ((ulong)bVar1 < 0x65) {
              pbVar9 = borg_items + bVar1;
            }
            else {
              pbVar9 = borg_shops[7].ware + (bVar1 - 100);
            }
            what = format("new best: %s",pbVar9);
            borg_note(what);
          }
        }
        else {
          borg_note("new best: no changes");
        }
      }
      mem_free(best);
      mem_free(test);
      _Var5 = borg_one_step_wearing_best(0);
      return _Var5;
    }
  }
  return false;
}

Assistant:

bool borg_best_stuff(void)
{
    int k;

    int32_t value;

    int i;

    uint8_t *test;
    uint8_t *best;

    /* only do this at home */
    if (shop_num != BORG_HOME)
        return false;

    /* if we don't need to do "best", check if we need to process the list */
    if (!borg.goal.do_best)
        return borg_one_step_wearing_best(0);

    /* must have a free inventory slot and a free home slot */
    if (borg_home_full() || borg_inventory_full())
        return false;

    /* only do this once per trip to town */
    if (!borg.goal.do_best)
        return false;

    best = mem_alloc(sizeof(uint8_t) * z_info->equip_slots_max);
    test = mem_alloc(sizeof(uint8_t) * z_info->equip_slots_max);
    /* Hack -- Initialize */
    for (k = 0; k < z_info->equip_slots_max; k++) {
        /* Initialize */
        best[k] = test[k] = 255;
    }

    /* Evaluate the inventory */
    value = borg.power;

    /* Determine the best possible equipment */
    (void)borg_best_stuff_aux(0, test, best, &value);

    /* Restore bonuses */
    borg_notice(true);

    /* convert the list into a list of items we can find even if they */
    /* change locations due to picking up and dropping items */
    /* Make first change. */
    borg_item *item;
    borg.goal.best_item
        = mem_zalloc(sizeof(struct borg_best) * z_info->equip_slots_max);
    bool found = false;
    for (k = 0; k < z_info->equip_slots_max; k++) {
        /* Get choice */
        i = best[k];

        /* Ignore non-changes */
        if (i == borg_best_stuff_order(k) || 255 == i)
            continue;

        found = true;
        if (i < 100) {
            item = &borg_items[i];
        } else {
            item = &borg_shops[BORG_HOME].ware[i - 100];
            borg.goal.best_item[k].home = true;
        }

        /* hopefully this is enough to get a unique item */
        borg.goal.best_item[k].tval = item->tval;
        borg.goal.best_item[k].pval = item->pval;
        borg.goal.best_item[k].sval = item->sval;
    }
    /* if we didn't change anything, clear out the changes */
    if (!found)
        borg_clear_best();

    /* we have done our best optimization.  */
    borg.goal.do_best = false;

    /* if we are being super chatty, spit out the new list of best */
    if (borg_cfg[BORG_VERBOSE]) {
        if (found) {
            for (i = 0; i < z_info->equip_slots_max; i++) {
                if (best[i] > 100) {
                    borg_note(format("new best: %s",
                        borg_shops[BORG_HOME].ware[best[i] - 100].desc));
                } else {
                    borg_note(format("new best: %s", borg_items[best[i]].desc));
                }
            }
        } else {
            borg_note("new best: no changes");
        }
    }
    mem_free(best);
    best = NULL;
    mem_free(test);
    test = NULL;

    return borg_one_step_wearing_best(0);
}